

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestStringToDoubleSeparator(void)

{
  double value;
  char *value_source;
  double expected;
  char *expected_source;
  double dVar1;
  char *file;
  uc16 in_stack_0000007e;
  bool *in_stack_00000080;
  undefined4 in_stack_00000088;
  uc16 in_stack_0000008c;
  undefined1 in_stack_0000008e;
  char in_stack_0000008f;
  bool *in_stack_00000090;
  undefined4 in_stack_00000098;
  int in_stack_0000009c;
  char *in_stack_000000a0;
  int in_stack_000000ac;
  char *in_stack_000000b0;
  char char_separator;
  uc16 separator;
  bool all_used;
  int processed;
  int flags;
  double in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  double in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int iVar2;
  char *in_stack_fffffffffffffe40;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0));
  value = double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,value);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    (int)((ulong)value >> 0x20));
  value_source = (char *)double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,value_source,value);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  expected = double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,expected,value_source,
                    value);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30,
                    (int)((ulong)expected >> 0x20),value_source,(int)((ulong)value >> 0x20));
  expected_source = (char *)double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,expected_source,(int)((ulong)expected >> 0x20),
                    value_source,(int)((ulong)value >> 0x20));
  dVar1 = double_conversion::Double::NaN();
  iVar2 = (int)((ulong)dVar1 >> 0x20);
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar2,expected_source,(int)((ulong)expected >> 0x20),
                    value_source,(int)((ulong)value >> 0x20));
  file = (char *)double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD(in_stack_000000a0,in_stack_0000009c,(double)in_stack_00000090,
         (int *)CONCAT17(in_stack_0000008f,
                         CONCAT16(in_stack_0000008e,CONCAT24(in_stack_0000008c,in_stack_00000088))),
         in_stack_00000080,in_stack_0000007e);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  double_conversion::Double::NaN();
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    (int)((ulong)value >> 0x20));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  StrToD16(in_stack_000000b0,in_stack_000000ac,(double)in_stack_000000a0,
           (int *)CONCAT44(in_stack_0000009c,in_stack_00000098),in_stack_00000090,in_stack_0000008f,
           in_stack_0000008c);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,value);
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB81((ulong)value >> 0x38,0));
  return;
}

Assistant:

TEST(StringToDoubleSeparator) {
  int flags;
  int processed;
  bool all_used;
  uc16 separator;

  separator = '\'';
  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(1.0, StrToD("000'001.0'0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0'0'0'0'0'1.0'0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("'1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1'.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.'0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0''1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1'0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1'", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0'e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+'1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("-'1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e-'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'+1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'-1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(1.0, StrToD("000 001.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0 0 0 0 0 1.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1 .0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1. 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0  1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 ", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0 e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+ 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("- 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+ 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e- 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e +1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e -1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(1.0, StrToD("000 001.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0 0 0 0 0 1.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  000 001.0 0   ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("   0 0 0 0 0 1.0 0   ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" 1.0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("1 .0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1. 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0  1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("1.0e1 ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("1.0e 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0 e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+ 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("- 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+ 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e- 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e +1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e -1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_HEX_FLOATS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(18.0, StrToD("0x1 2", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("0x0 0", flags, 1.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD("0x1 2 3 4 5 6 7 8 9", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(18.0, StrToD(" 0x1 2 ", flags, 0.0,
                        &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 0x0 ", flags, 1.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD(" 0x1 2 3 4 5 6 7 8 9 ", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0xabcdef),
           StrToD("0xa b c d e f", flags, 0.0,
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("0x 1 2", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0 x0", flags, 1.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x1 2  3 4 5 6 7 8 9", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 0 x1 2 ", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(3.0,
           StrToD("0x0 3p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0,
           StrToD("0x.0 0p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD("0x3.0 0p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD("0x0 3.p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("0x 3p0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x.0 p0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3.0p0 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x0 3.p 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3p+ 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x.0p- 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3.0p +0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x0 3.p -0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  separator = 0x202F;
  char char_separator = '@';
  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_HEX_FLOATS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(18.0,
           StrToD16("0x1@2", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD16("0x0@0", flags, 1.0, &processed, &all_used,
                         char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD16("0x1@2@3@4@5@6@7@8@9", flags, Double::NaN(),
                    &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(18.0, StrToD16(" 0x1@2 ", flags, 0.0,
                          &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0xabcdef),
           StrToD16("0xa@b@c@d@e@f", flags, 0.0,
                    &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD16("0x@1@2", flags, 0.0,
                    &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD16("0@x0", flags, 1.0,
                    &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD16("0x1@2@@3@4@5@6@7@8@9", flags, Double::NaN(),
                  &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(3.0,
           StrToD16("0x0@3p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(0.0,
           StrToD16("0x.0@0p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD16("0x3.0@0p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD16("0x0@3.p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);
}